

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Slow(CodedInputStream *this,uint32 *value)

{
  bool bVar1;
  uint64 result;
  uint32 local_10 [2];
  
  bVar1 = ReadVarint64Fallback(this,(uint64 *)local_10);
  if (bVar1) {
    *value = local_10[0];
  }
  return bVar1;
}

Assistant:

bool CodedInputStream::ReadVarint32Slow(uint32* value) {
  uint64 result;
  // Directly invoke ReadVarint64Fallback, since we already tried to optimize
  // for one-byte varints.
  if (!ReadVarint64Fallback(&result)) return false;
  *value = (uint32)result;
  return true;
}